

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

size_t __thiscall rcg::Buffer::getSizeFilled(Buffer *this)

{
  void *stream;
  unsigned_long uVar1;
  
  stream = Stream::getHandle(this->parent);
  uVar1 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,stream,this->buffer,9);
  return uVar1;
}

Assistant:

size_t Buffer::getSizeFilled() const
{
  return getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                GenTL::BUFFER_INFO_SIZE_FILLED);
}